

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

Status kwssys::SystemTools::SetPermissions(string *file,mode_t mode,bool honor_umask)

{
  bool bVar1;
  __mode_t __mask;
  int iVar2;
  Status SVar3;
  
  bVar1 = PathExists(file);
  if (bVar1) {
    if (honor_umask) {
      __mask = umask(0);
      umask(__mask);
      mode = mode & ~__mask;
    }
    iVar2 = chmod((file->_M_dataplus)._M_p,mode);
    if (iVar2 < 0) {
      SVar3 = Status::POSIX_errno();
      return SVar3;
    }
    SVar3.Kind_ = Success;
    SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
  }
  else {
    SVar3.Kind_ = POSIX;
    SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x2;
  }
  return SVar3;
}

Assistant:

Status SystemTools::SetPermissions(std::string const& file, mode_t mode,
                                   bool honor_umask)
{
  if (!SystemTools::PathExists(file)) {
    return Status::POSIX(ENOENT);
  }
  if (honor_umask) {
    mode_t currentMask = umask(0);
    umask(currentMask);
    mode &= ~currentMask;
  }
#ifdef _WIN32
  if (_wchmod(Encoding::ToWindowsExtendedPath(file).c_str(), mode) < 0)
#else
  if (chmod(file.c_str(), mode) < 0)
#endif
  {
    return Status::POSIX_errno();
  }

  return Status::Success();
}